

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O0

Value * __thiscall duckdb::ViewColumnHelper::ColumnComment(ViewColumnHelper *this,idx_t col)

{
  bool bVar1;
  undefined8 in_RSI;
  LogicalTypeId id;
  Value *in_RDI;
  size_type in_stack_ffffffffffffff98;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffffa0;
  Value *this_00;
  LogicalType *in_stack_ffffffffffffffc0;
  
  id = (LogicalTypeId)((ulong)in_RSI >> 0x38);
  this_00 = in_RDI;
  bVar1 = ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::empty
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_RDI);
  if (bVar1) {
    LogicalType::LogicalType(in_stack_ffffffffffffffc0,id);
    Value::Value(this_00,&in_RDI->type_);
    LogicalType::~LogicalType((LogicalType *)0x14555df);
  }
  else {
    vector<duckdb::Value,_true>::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Value::Value(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

const Value ColumnComment(idx_t col) override {
		if (entry.column_comments.empty()) {
			return Value();
		}
		D_ASSERT(entry.column_comments.size() == entry.types.size());
		return entry.column_comments[col];
	}